

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O0

string * __thiscall m2d::savanna::url::port_str_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  bool bVar1;
  __type_conflict1 _Var2;
  __type_conflict1 local_81;
  allocator local_67;
  allocator local_66;
  byte local_65;
  string local_58;
  string local_38;
  url *local_18;
  url *this_local;
  
  local_18 = this;
  this_local = (url *)__return_storage_ptr__;
  bVar1 = std::operator==(&this->port_,"");
  if (bVar1) {
    scheme_abi_cxx11_(&local_38,this);
    _Var2 = std::operator==(&local_38,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            url_scheme::https_abi_cxx11_);
    local_65 = 0;
    local_81 = true;
    if (!_Var2) {
      scheme_abi_cxx11_(&local_58,this);
      local_65 = 1;
      local_81 = std::operator==(&local_58,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)url_scheme::wss_abi_cxx11_);
    }
    if ((local_65 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_38);
    if (local_81 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"80",&local_67);
      std::allocator<char>::~allocator((allocator<char> *)&local_67);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"443",&local_66);
      std::allocator<char>::~allocator((allocator<char> *)&local_66);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->port_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string port_str()
		{
			if (port_ == "") {
				if (scheme() == savanna::url_scheme::https || scheme() == savanna::url_scheme::wss) {
					return "443";
				}
				return "80";
			}

			return port_;
		}